

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O0

void __thiscall obs::signal<void_()>::operator()<>(signal<void_()> *this)

{
  bool bVar1;
  slot<void_()> *this_00;
  slot<void_()> *slot;
  undefined1 local_68 [8];
  iterator __end0;
  iterator __begin0;
  slot_list *__range3;
  signal<void_()> *this_local;
  
  safe_list<obs::slot<void_()>_>::begin((iterator *)&__end0.m_next_iterator,&this->m_slots);
  safe_list<obs::slot<void_()>_>::end((iterator *)local_68,&this->m_slots);
  while( true ) {
    bVar1 = safe_list<obs::slot<void_()>_>::iterator::operator!=
                      ((iterator *)&__end0.m_next_iterator,(iterator *)local_68);
    if (!bVar1) break;
    this_00 = safe_list<obs::slot<void_()>_>::iterator::operator*
                        ((iterator *)&__end0.m_next_iterator);
    if (this_00 != (slot<void_()> *)0x0) {
      slot<void_()>::operator()<>(this_00);
    }
    safe_list<obs::slot<void_()>_>::iterator::operator++((iterator *)&__end0.m_next_iterator);
  }
  safe_list<obs::slot<void_()>_>::iterator::~iterator((iterator *)local_68);
  safe_list<obs::slot<void_()>_>::iterator::~iterator((iterator *)&__end0.m_next_iterator);
  return;
}

Assistant:

void operator()(Args2&&...args) {
    for (auto slot : m_slots)
      if (slot)
        (*slot)(std::forward<Args2>(args)...);
  }